

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O1

ZeroCopyOutputStream * __thiscall
google::protobuf::compiler::GeneratorResponseContext::OpenForInsert
          (GeneratorResponseContext *this,string *filename,string *insertion_point)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  CodeGeneratorResponse *pCVar4;
  void **ppvVar5;
  CodeGeneratorResponse_File *pCVar6;
  string *psVar7;
  StringOutputStream *this_00;
  
  pCVar4 = this->response_;
  iVar2 = (pCVar4->file_).super_RepeatedPtrFieldBase.current_size_;
  iVar3 = (pCVar4->file_).super_RepeatedPtrFieldBase.allocated_size_;
  if (iVar2 < iVar3) {
    ppvVar5 = (pCVar4->file_).super_RepeatedPtrFieldBase.elements_;
    (pCVar4->file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pCVar6 = (CodeGeneratorResponse_File *)ppvVar5[iVar2];
  }
  else {
    iVar2 = (pCVar4->file_).super_RepeatedPtrFieldBase.total_size_;
    if (iVar3 == iVar2) {
      internal::RepeatedPtrFieldBase::Reserve(&(pCVar4->file_).super_RepeatedPtrFieldBase,iVar2 + 1)
      ;
    }
    piVar1 = &(pCVar4->file_).super_RepeatedPtrFieldBase.allocated_size_;
    *piVar1 = *piVar1 + 1;
    pCVar6 = internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>::
             New();
    ppvVar5 = (pCVar4->file_).super_RepeatedPtrFieldBase.elements_;
    iVar2 = (pCVar4->file_).super_RepeatedPtrFieldBase.current_size_;
    (pCVar4->file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    ppvVar5[iVar2] = pCVar6;
  }
  *(byte *)pCVar6->_has_bits_ = (byte)pCVar6->_has_bits_[0] | 1;
  if (pCVar6->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar7 = (string *)operator_new(0x20);
    (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
    psVar7->_M_string_length = 0;
    (psVar7->field_2)._M_local_buf[0] = '\0';
    pCVar6->name_ = psVar7;
  }
  std::__cxx11::string::_M_assign((string *)pCVar6->name_);
  *(byte *)pCVar6->_has_bits_ = (byte)pCVar6->_has_bits_[0] | 2;
  if (pCVar6->insertion_point_ == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar7 = (string *)operator_new(0x20);
    (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
    psVar7->_M_string_length = 0;
    (psVar7->field_2)._M_local_buf[0] = '\0';
    pCVar6->insertion_point_ = psVar7;
  }
  std::__cxx11::string::_M_assign((string *)pCVar6->insertion_point_);
  this_00 = (StringOutputStream *)operator_new(0x10);
  *(byte *)pCVar6->_has_bits_ = (byte)pCVar6->_has_bits_[0] | 4;
  if (pCVar6->content_ == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar7 = (string *)operator_new(0x20);
    (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
    psVar7->_M_string_length = 0;
    (psVar7->field_2)._M_local_buf[0] = '\0';
    pCVar6->content_ = psVar7;
  }
  io::StringOutputStream::StringOutputStream(this_00,pCVar6->content_);
  return &this_00->super_ZeroCopyOutputStream;
}

Assistant:

virtual io::ZeroCopyOutputStream* OpenForInsert(
      const string& filename, const string& insertion_point) {
    CodeGeneratorResponse::File* file = response_->add_file();
    file->set_name(filename);
    file->set_insertion_point(insertion_point);
    return new io::StringOutputStream(file->mutable_content());
  }